

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::push_back
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this,
          ShapeHandle *value)

{
  size_t sVar1;
  ShapeHandle *pSVar2;
  size_t sVar3;
  
  sVar1 = this->nAlloc;
  sVar3 = this->nStored;
  if (sVar1 == sVar3) {
    sVar3 = 4;
    if (sVar1 != 0) {
      sVar3 = sVar1 * 2;
    }
    reserve(this,sVar3);
    sVar3 = this->nStored;
  }
  pSVar2 = this->ptr;
  pSVar2[sVar3].
  super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  .bits = 0;
  pSVar2[sVar3].
  super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  .bits = (value->
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          ).bits;
  this->nStored = sVar3 + 1;
  return;
}

Assistant:

void push_back(const T &value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, value);
        ++nStored;
    }